

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_tests.cpp
# Opt level: O3

void __thiscall rpc_tests::rpc_namedparams::test_method(rpc_namedparams *this)

{
  int iVar1;
  __pthread_internal_list *p_Var2;
  RPCTestingSetup *pRVar3;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  iterator pvVar5;
  long lVar6;
  long in_FS_OFFSET;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
  __l;
  const_string file;
  string_view json;
  const_string file_00;
  string_view json_00;
  const_string file_01;
  const_string file_02;
  string_view json_01;
  const_string file_03;
  string_view json_02;
  const_string file_04;
  const_string file_05;
  string_view json_03;
  const_string file_06;
  const_string file_07;
  string_view json_04;
  const_string file_08;
  string_view json_05;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  check_type cVar7;
  _Vector_impl_data in_stack_fffffffffffff9c8;
  undefined1 *local_620;
  undefined1 *local_618;
  char *local_610;
  char *local_608;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  local_600;
  undefined1 *local_5e8;
  undefined1 *local_5e0;
  char *local_5d8;
  char *local_5d0;
  char *local_598;
  char *local_590;
  undefined1 *local_588;
  undefined1 *local_580;
  char *local_578;
  char *local_570;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  local_568;
  undefined1 *local_550;
  undefined1 *local_548;
  char *local_540;
  char *local_538;
  char *local_500;
  char *local_4f8;
  undefined1 *local_4f0;
  undefined1 *local_4e8;
  char *local_4e0;
  char *local_4d8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  local_4d0;
  undefined1 *local_4b8;
  undefined1 *local_4b0;
  char *local_4a8;
  char *local_4a0;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  local_498;
  undefined1 *local_480;
  undefined1 *local_478;
  char *local_470;
  char *local_468;
  char *local_430;
  char *local_428;
  undefined1 *local_420;
  undefined1 *local_418;
  char *local_410;
  char *local_408;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  local_400;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  char *local_3d0;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  local_3c8;
  lazy_ostream local_3b0;
  undefined1 *local_3a0;
  char *local_398;
  undefined1 *local_390;
  undefined1 *local_388;
  char *local_380;
  char *local_378;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  arg_names;
  char *local_358;
  undefined **local_350 [2];
  undefined1 *local_340;
  undefined8 local_338;
  undefined1 local_330 [56];
  assertion_result local_2f8 [2];
  UniValue local_2c0;
  UniValue local_248;
  undefined1 local_1d0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a8;
  vector<UniValue,_std::allocator<UniValue>_> local_190;
  UniValue local_178;
  _Head_base<0UL,_CSemaphore_*,_false> local_120;
  undefined1 local_110 [16];
  undefined1 local_100 [8];
  bool local_f8;
  undefined7 uStack_f7;
  undefined1 *local_f0;
  undefined1 local_e8 [16];
  undefined1 local_d8 [24];
  undefined1 local_c0 [32];
  undefined1 local_a0 [24];
  pointer local_88 [2];
  undefined1 local_78 [40];
  __pthread_internal_list local_50;
  undefined1 local_40;
  size_t local_38;
  
  local_38 = *(size_t *)(in_FS_OFFSET + 0x28);
  local_100 = (undefined1  [8])&local_f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"arg1","");
  local_e8[8] = false;
  local_d8._0_8_ = local_d8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"arg2","");
  local_c0[8] = '\0';
  local_c0._16_8_ = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_c0 + 0x10),"arg3","");
  local_a0[0x10] = 0;
  local_88[0] = (pointer)local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"arg4","");
  local_78[0x10] = '\0';
  p_Var2 = &local_50;
  local_78._24_8_ = p_Var2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_78 + 0x18),"arg5","");
  local_40 = 0;
  __l._M_len = 5;
  __l._M_array = (iterator)local_100;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::vector(&arg_names,__l,(allocator_type *)&local_178);
  lVar6 = -200;
  do {
    if (p_Var2 != p_Var2[-1].__prev) {
      operator_delete(p_Var2[-1].__prev,(ulong)((long)&p_Var2->__prev->__prev + 1));
    }
    p_Var2 = (__pthread_internal_list *)&p_Var2[-3].__next;
    lVar6 = lVar6 + 0x28;
  } while (lVar6 != 0);
  local_380 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_378 = "";
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x5c;
  file.m_begin = (iterator)&local_380;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_390,msg);
  local_3b0.m_empty = false;
  local_3b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_3a0 = boost::unit_test::lazy_ostream::inst;
  local_398 = "";
  json._M_str = "{\"arg2\": 2, \"arg4\": 4}";
  json._M_len = 0x16;
  JSON(&local_178,json);
  pRVar3 = (RPCTestingSetup *)&arg_names;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::vector(&local_3c8,
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
            *)pRVar3);
  RPCTestingSetup::TransformParams
            ((UniValue *)local_100,pRVar3,&local_178,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
              )in_stack_fffffffffffff9c8);
  ::UniValue::write_abi_cxx11_((UniValue *)&local_120,(int)local_100,(void *)0x0,0);
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_120
                     ,"[null,2,null,4]");
  local_2f8[0].p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar1 == 0);
  local_2f8[0].m_message.px = (element_type *)0x0;
  local_2f8[0].m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_330._40_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_330._48_8_ = "";
  local_330._32_8_ = local_330;
  local_330[0x10] = 0;
  local_330._8_8_ = &PTR__lazy_ostream_01388fc8;
  local_330._24_8_ = boost::unit_test::lazy_ostream::inst;
  local_338 = &local_358;
  local_358 = "[null,2,null,4]";
  local_350[1]._0_1_ = '\0';
  local_350[0] = &PTR__lazy_ostream_0138a770;
  local_340 = boost::unit_test::lazy_ostream::inst;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_330._0_8_ = (CTxMemPool *)&local_120;
  boost::test_tools::tt_detail::report_assertion
            (local_2f8,&local_3b0,1,2,REQUIRE,0xe9cff5,(size_t)(local_330 + 0x28),0x5c,local_330 + 8
             ,"\"[null,2,null,4]\"",local_350);
  boost::detail::shared_count::~shared_count(&local_2f8[0].m_message.pn);
  if (local_120._M_head_impl != (CSemaphore *)local_110) {
    operator_delete(local_120._M_head_impl,(ulong)((long)(_Rb_tree_color *)local_110._0_8_ + 1));
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)local_c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_d8);
  if ((undefined1 *)CONCAT71(uStack_f7,local_f8) != local_e8) {
    operator_delete((undefined1 *)CONCAT71(uStack_f7,local_f8),local_e8._0_8_ + 1);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~vector(&local_3c8);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_178.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_178.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178.val._M_dataplus._M_p != &local_178.val.field_2) {
    operator_delete(local_178.val._M_dataplus._M_p,local_178.val.field_2._M_allocated_capacity + 1);
  }
  local_3d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_3d0 = "";
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x60;
  file_00.m_begin = (iterator)&local_3d8;
  msg_00.m_end = pvVar5;
  msg_00.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_3e8,
             msg_00);
  json_00._M_str = "{\"arg2\": 2, \"arg2\": 4}";
  json_00._M_len = 0x16;
  JSON((UniValue *)local_100,json_00);
  pRVar3 = (RPCTestingSetup *)&arg_names;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::vector(&local_400,
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
            *)pRVar3);
  RPCTestingSetup::TransformParams
            ((UniValue *)local_1d0,pRVar3,(UniValue *)local_100,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
              )in_stack_fffffffffffff9c8);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_190);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._8_8_ != &local_1b8) {
    operator_delete((void *)local_1d0._8_8_,(ulong)(local_1b8._M_allocated_capacity + 1));
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~vector(&local_400);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)local_c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_d8);
  if ((undefined1 *)CONCAT71(uStack_f7,local_f8) != local_e8) {
    operator_delete((undefined1 *)CONCAT71(uStack_f7,local_f8),local_e8._0_8_ + 1);
  }
  local_410 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_408 = "";
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar7 = 0x5590ca;
  file_01.m_end = (iterator)0x60;
  file_01.m_begin = (iterator)&local_410;
  msg_01.m_end = pvVar5;
  msg_01.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_420,
             msg_01);
  local_178.typ._0_1_ = VNULL;
  local_178.val._M_dataplus._M_p = (pointer)0x0;
  local_178.val._M_string_length = 0;
  local_f8 = false;
  local_100 = (undefined1  [8])&PTR__lazy_ostream_0138a0d0;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8._0_8_ = "exception UniValue expected but not raised";
  local_430 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_428 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_178,(lazy_ostream *)local_100,1,1,WARN,_cVar7,
             (size_t)&local_430,0x60);
  boost::detail::shared_count::~shared_count((shared_count *)&local_178.val._M_string_length);
  local_470 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_468 = "";
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x63;
  file_02.m_begin = (iterator)&local_470;
  msg_02.m_end = pvVar5;
  msg_02.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_480,
             msg_02);
  local_3b0.m_empty = false;
  local_3b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_3a0 = boost::unit_test::lazy_ostream::inst;
  local_398 = "";
  json_01._M_str = "{\"arg5\": 5, \"args\": [1, 2], \"arg4\": 4}";
  json_01._M_len = 0x26;
  JSON(&local_178,json_01);
  pRVar3 = (RPCTestingSetup *)&arg_names;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::vector(&local_498,
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
            *)pRVar3);
  RPCTestingSetup::TransformParams
            ((UniValue *)local_100,pRVar3,&local_178,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
              )in_stack_fffffffffffff9c8);
  ::UniValue::write_abi_cxx11_((UniValue *)&local_120,(int)local_100,(void *)0x0,0);
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_120
                     ,"[1,2,null,4,5]");
  local_2f8[0].p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar1 == 0);
  local_2f8[0].m_message.px = (element_type *)0x0;
  local_2f8[0].m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_330._40_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_330._48_8_ = "";
  local_330[0x10] = 0;
  local_330._8_8_ = &PTR__lazy_ostream_01388fc8;
  local_330._24_8_ = boost::unit_test::lazy_ostream::inst;
  local_330._32_8_ = local_330;
  local_358 = "[1,2,null,4,5]";
  local_350[1]._0_1_ = '\0';
  local_350[0] = &PTR__lazy_ostream_01389088;
  local_340 = boost::unit_test::lazy_ostream::inst;
  local_338 = &local_358;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_330._0_8_ = (CTxMemPool *)&local_120;
  boost::test_tools::tt_detail::report_assertion
            (local_2f8,&local_3b0,1,2,REQUIRE,0xe9d1b4,(size_t)(local_330 + 0x28),99,local_330 + 8,
             "\"[1,2,null,4,5]\"",local_350);
  boost::detail::shared_count::~shared_count(&local_2f8[0].m_message.pn);
  if (local_120._M_head_impl != (CSemaphore *)local_110) {
    operator_delete(local_120._M_head_impl,(ulong)((long)(_Rb_tree_color *)local_110._0_8_ + 1));
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)local_c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_d8);
  if ((undefined1 *)CONCAT71(uStack_f7,local_f8) != local_e8) {
    operator_delete((undefined1 *)CONCAT71(uStack_f7,local_f8),(ulong)(local_e8._0_8_ + 1));
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~vector(&local_498);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_178.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_178.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178.val._M_dataplus._M_p != &local_178.val.field_2) {
    operator_delete(local_178.val._M_dataplus._M_p,local_178.val.field_2._M_allocated_capacity + 1);
  }
  local_4a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_4a0 = "";
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x67;
  file_03.m_begin = (iterator)&local_4a8;
  msg_03.m_end = pvVar5;
  msg_03.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_4b8,
             msg_03);
  json_02._M_str = "{\"arg2\": 2, \"unknown\": 6}";
  json_02._M_len = 0x19;
  JSON((UniValue *)local_100,json_02);
  pRVar3 = (RPCTestingSetup *)&arg_names;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::vector(&local_4d0,
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
            *)pRVar3);
  RPCTestingSetup::TransformParams
            (&local_248,pRVar3,(UniValue *)local_100,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
              )in_stack_fffffffffffff9c8);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_248.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_248.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248.val._M_dataplus._M_p != &local_248.val.field_2) {
    operator_delete(local_248.val._M_dataplus._M_p,
                    (ulong)(local_248.val.field_2._M_allocated_capacity + 1));
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~vector(&local_4d0);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)local_c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_d8);
  if ((undefined1 *)CONCAT71(uStack_f7,local_f8) != local_e8) {
    operator_delete((undefined1 *)CONCAT71(uStack_f7,local_f8),(ulong)(local_e8._0_8_ + 1));
  }
  local_4e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_4d8 = "";
  local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar7 = 0x5594f3;
  file_04.m_end = (iterator)0x67;
  file_04.m_begin = (iterator)&local_4e0;
  msg_04.m_end = pvVar5;
  msg_04.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_4f0,
             msg_04);
  local_178.typ._0_1_ = VNULL;
  local_178.val._M_dataplus._M_p = (pointer)0x0;
  local_178.val._M_string_length = 0;
  local_f8 = false;
  local_100 = (undefined1  [8])&PTR__lazy_ostream_0138a0d0;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8._0_8_ = "exception UniValue expected but not raised";
  local_500 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_4f8 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_178,(lazy_ostream *)local_100,1,1,WARN,_cVar7,
             (size_t)&local_500,0x67);
  boost::detail::shared_count::~shared_count((shared_count *)&local_178.val._M_string_length);
  local_540 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_538 = "";
  local_550 = &boost::unit_test::basic_cstring<char_const>::null;
  local_548 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x6b;
  file_05.m_begin = (iterator)&local_540;
  msg_05.m_end = pvVar5;
  msg_05.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_550,
             msg_05);
  json_03._M_str = "{\"args\": [1,2,3], \"arg4\": 4, \"arg2\": 2}";
  json_03._M_len = 0x27;
  JSON((UniValue *)local_100,json_03);
  pRVar3 = (RPCTestingSetup *)&arg_names;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::vector(&local_568,
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
            *)pRVar3);
  RPCTestingSetup::TransformParams
            (&local_2c0,pRVar3,(UniValue *)local_100,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
              )in_stack_fffffffffffff9c8);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_2c0.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2c0.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0.val._M_dataplus._M_p != &local_2c0.val.field_2) {
    operator_delete(local_2c0.val._M_dataplus._M_p,
                    (ulong)(local_2c0.val.field_2._M_allocated_capacity + 1));
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~vector(&local_568);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)local_c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_d8);
  if ((undefined1 *)CONCAT71(uStack_f7,local_f8) != local_e8) {
    operator_delete((undefined1 *)CONCAT71(uStack_f7,local_f8),(ulong)(local_e8._0_8_ + 1));
  }
  local_578 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_570 = "";
  local_588 = &boost::unit_test::basic_cstring<char_const>::null;
  local_580 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar7 = 0x55969a;
  file_06.m_end = (iterator)0x6b;
  file_06.m_begin = (iterator)&local_578;
  msg_06.m_end = pvVar5;
  msg_06.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_588,
             msg_06);
  local_178.typ._0_1_ = VNULL;
  local_178.val._M_dataplus._M_p = (pointer)0x0;
  local_178.val._M_string_length = 0;
  local_f8 = false;
  local_100 = (undefined1  [8])&PTR__lazy_ostream_0138a0d0;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8._0_8_ = "exception UniValue expected but not raised";
  local_598 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_590 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_178,(lazy_ostream *)local_100,1,1,WARN,_cVar7,
             (size_t)&local_598,0x6b);
  boost::detail::shared_count::~shared_count((shared_count *)&local_178.val._M_string_length);
  local_5d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_5d0 = "";
  local_5e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x6e;
  file_07.m_begin = (iterator)&local_5d8;
  msg_07.m_end = pvVar5;
  msg_07.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_5e8,
             msg_07);
  local_3b0.m_empty = false;
  local_3b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_3a0 = boost::unit_test::lazy_ostream::inst;
  local_398 = "";
  json_04._M_str = "{\"args\": [1,2,3,4,5,6,7,8,9,10]}";
  json_04._M_len = 0x20;
  JSON(&local_178,json_04);
  pRVar3 = (RPCTestingSetup *)&arg_names;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::vector(&local_600,
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
            *)pRVar3);
  RPCTestingSetup::TransformParams
            ((UniValue *)local_100,pRVar3,&local_178,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
              )in_stack_fffffffffffff9c8);
  ::UniValue::write_abi_cxx11_((UniValue *)&local_120,(int)local_100,(void *)0x0,0);
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_120
                     ,"[1,2,3,4,5,6,7,8,9,10]");
  local_2f8[0].p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar1 == 0);
  local_2f8[0].m_message.px = (element_type *)0x0;
  local_2f8[0].m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_330._40_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_330._48_8_ = "";
  local_330[0x10] = 0;
  local_330._8_8_ = &PTR__lazy_ostream_01388fc8;
  local_330._24_8_ = boost::unit_test::lazy_ostream::inst;
  local_330._32_8_ = local_330;
  local_358 = "[1,2,3,4,5,6,7,8,9,10]";
  local_350[1]._0_1_ = '\0';
  local_350[0] = &PTR__lazy_ostream_0138c100;
  local_340 = boost::unit_test::lazy_ostream::inst;
  local_338 = &local_358;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_330._0_8_ = (CTxMemPool *)&local_120;
  boost::test_tools::tt_detail::report_assertion
            (local_2f8,&local_3b0,1,2,REQUIRE,0xe9d493,(size_t)(local_330 + 0x28),0x6e,local_330 + 8
             ,"\"[1,2,3,4,5,6,7,8,9,10]\"",local_350);
  boost::detail::shared_count::~shared_count(&local_2f8[0].m_message.pn);
  if (local_120._M_head_impl != (CSemaphore *)local_110) {
    operator_delete(local_120._M_head_impl,(ulong)((long)(_Rb_tree_color *)local_110._0_8_ + 1));
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)local_c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_d8);
  if ((undefined1 *)CONCAT71(uStack_f7,local_f8) != local_e8) {
    operator_delete((undefined1 *)CONCAT71(uStack_f7,local_f8),(ulong)(local_e8._0_8_ + 1));
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~vector(&local_600);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_178.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_178.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178.val._M_dataplus._M_p != &local_178.val.field_2) {
    operator_delete(local_178.val._M_dataplus._M_p,local_178.val.field_2._M_allocated_capacity + 1);
  }
  local_610 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_608 = "";
  local_620 = &boost::unit_test::basic_cstring<char_const>::null;
  local_618 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x6f;
  file_08.m_begin = (iterator)&local_610;
  msg_08.m_end = pvVar5;
  msg_08.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_620,
             msg_08);
  local_3b0.m_empty = false;
  local_3b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_3a0 = boost::unit_test::lazy_ostream::inst;
  local_398 = "";
  json_05._M_str = "[1,2,3,4,5,6,7,8,9,10]";
  json_05._M_len = 0x16;
  JSON(&local_178,json_05);
  pRVar3 = (RPCTestingSetup *)&arg_names;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
            *)&stack0xfffffffffffff9c8,
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
            *)pRVar3);
  RPCTestingSetup::TransformParams
            ((UniValue *)local_100,pRVar3,&local_178,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
              )in_stack_fffffffffffff9c8);
  ::UniValue::write_abi_cxx11_((UniValue *)&local_120,(int)local_100,(void *)0x0,0);
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_120
                     ,"[1,2,3,4,5,6,7,8,9,10]");
  local_2f8[0].p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar1 == 0);
  local_2f8[0].m_message.px = (element_type *)0x0;
  local_2f8[0].m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_330._40_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_330._48_8_ = "";
  local_330[0x10] = 0;
  local_330._8_8_ = &PTR__lazy_ostream_01388fc8;
  local_330._24_8_ = boost::unit_test::lazy_ostream::inst;
  local_330._32_8_ = local_330;
  local_358 = "[1,2,3,4,5,6,7,8,9,10]";
  local_350[1]._0_1_ = '\0';
  local_350[0] = &PTR__lazy_ostream_0138c100;
  local_340 = boost::unit_test::lazy_ostream::inst;
  local_338 = &local_358;
  local_330._0_8_ = (CTxMemPool *)&local_120;
  boost::test_tools::tt_detail::report_assertion
            (local_2f8,&local_3b0,1,2,REQUIRE,0xe9d513,(size_t)(local_330 + 0x28),0x6f,local_330 + 8
             ,"\"[1,2,3,4,5,6,7,8,9,10]\"",local_350);
  boost::detail::shared_count::~shared_count(&local_2f8[0].m_message.pn);
  if (local_120._M_head_impl != (CSemaphore *)local_110) {
    operator_delete(local_120._M_head_impl,(ulong)((long)(_Rb_tree_color *)local_110._0_8_ + 1));
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)local_c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_d8);
  if ((undefined1 *)CONCAT71(uStack_f7,local_f8) != local_e8) {
    operator_delete((undefined1 *)CONCAT71(uStack_f7,local_f8),(ulong)(local_e8._0_8_ + 1));
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             *)&stack0xfffffffffffff9c8);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_178.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_178.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178.val._M_dataplus._M_p != &local_178.val.field_2) {
    operator_delete(local_178.val._M_dataplus._M_p,local_178.val.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~vector(&arg_names);
  if (*(size_t *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(rpc_namedparams)
{
    const std::vector<std::pair<std::string, bool>> arg_names{{"arg1", false}, {"arg2", false}, {"arg3", false}, {"arg4", false}, {"arg5", false}};

    // Make sure named arguments are transformed into positional arguments in correct places separated by nulls
    BOOST_CHECK_EQUAL(TransformParams(JSON(R"({"arg2": 2, "arg4": 4})"), arg_names).write(), "[null,2,null,4]");

    // Make sure named argument specified multiple times raises an exception
    BOOST_CHECK_EXCEPTION(TransformParams(JSON(R"({"arg2": 2, "arg2": 4})"), arg_names), UniValue,
                          HasJSON(R"({"code":-8,"message":"Parameter arg2 specified multiple times"})"));

    // Make sure named and positional arguments can be combined.
    BOOST_CHECK_EQUAL(TransformParams(JSON(R"({"arg5": 5, "args": [1, 2], "arg4": 4})"), arg_names).write(), "[1,2,null,4,5]");

    // Make sure a unknown named argument raises an exception
    BOOST_CHECK_EXCEPTION(TransformParams(JSON(R"({"arg2": 2, "unknown": 6})"), arg_names), UniValue,
                          HasJSON(R"({"code":-8,"message":"Unknown named parameter unknown"})"));

    // Make sure an overlap between a named argument and positional argument raises an exception
    BOOST_CHECK_EXCEPTION(TransformParams(JSON(R"({"args": [1,2,3], "arg4": 4, "arg2": 2})"), arg_names), UniValue,
                          HasJSON(R"({"code":-8,"message":"Parameter arg2 specified twice both as positional and named argument"})"));

    // Make sure extra positional arguments can be passed through to the method implementation, as long as they don't overlap with named arguments.
    BOOST_CHECK_EQUAL(TransformParams(JSON(R"({"args": [1,2,3,4,5,6,7,8,9,10]})"), arg_names).write(), "[1,2,3,4,5,6,7,8,9,10]");
    BOOST_CHECK_EQUAL(TransformParams(JSON(R"([1,2,3,4,5,6,7,8,9,10])"), arg_names).write(), "[1,2,3,4,5,6,7,8,9,10]");
}